

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_3_2::anon_unknown_30::loadLevel(DeepTiledInputFile *in,DeepImage *img,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  DeepImageChannel *pDVar5;
  undefined4 in_ECX;
  int in_EDX;
  long *in_RSI;
  DeepFrameBuffer *in_RDI;
  Edit edit;
  ConstIterator i;
  DeepFrameBuffer fb;
  DeepImageLevel *level;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int iVar6;
  DeepFrameBuffer *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb7;
  undefined1 local_128 [56];
  iterator local_f0;
  iterator local_e0;
  Slice local_88 [104];
  DeepImageLevel *local_20;
  int local_14;
  DeepFrameBuffer *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_20 = (DeepImageLevel *)(**(code **)(*in_RSI + 0x28))(in_RSI,in_EDX,in_ECX);
  DeepFrameBuffer::DeepFrameBuffer(in_stack_fffffffffffffe90);
  DeepImageLevel::sampleCounts(local_20);
  SampleCountChannel::slice
            ((SampleCountChannel *)CONCAT17(in_stack_fffffffffffffeb7,in_stack_fffffffffffffeb0));
  Imf_3_2::DeepFrameBuffer::insertSampleCountSlice(local_88);
  local_e0._M_node =
       (_Base_ptr)
       DeepImageLevel::begin
                 ((DeepImageLevel *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  DeepImageLevel::ConstIterator::ConstIterator
            ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (Iterator *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  while( true ) {
    local_f0._M_node =
         (_Base_ptr)
         DeepImageLevel::end((DeepImageLevel *)
                             CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    DeepImageLevel::ConstIterator::ConstIterator
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               (Iterator *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       (ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    if (!bVar1) break;
    psVar4 = DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x1271c8);
    pDVar5 = DeepImageLevel::ConstIterator::channel((ConstIterator *)0x1271d7);
    (*(pDVar5->super_ImageChannel)._vptr_ImageChannel[4])(local_128);
    Imf_3_2::DeepFrameBuffer::insert((string *)local_88,(DeepSlice *)psVar4);
    DeepImageLevel::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70));
  }
  Imf_3_2::DeepTiledInputFile::setFrameBuffer(local_8);
  DeepImageLevel::sampleCounts(local_20);
  SampleCountChannel::Edit::Edit
            ((Edit *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (SampleCountChannel *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  iVar6 = (int)local_8;
  iVar2 = Imf_3_2::DeepTiledInputFile::numXTiles((int)local_8);
  iVar3 = Imf_3_2::DeepTiledInputFile::numYTiles((int)local_8);
  Imf_3_2::DeepTiledInputFile::readPixelSampleCounts(iVar6,0,iVar2 + -1,0,iVar3 + -1,local_14);
  SampleCountChannel::Edit::~Edit((Edit *)0x1272e0);
  iVar6 = (int)local_8;
  iVar2 = Imf_3_2::DeepTiledInputFile::numXTiles((int)local_8);
  iVar2 = iVar2 + -1;
  iVar3 = Imf_3_2::DeepTiledInputFile::numYTiles((int)local_8);
  Imf_3_2::DeepTiledInputFile::readTiles(iVar6,0,iVar2,0,iVar3 + -1,local_14);
  DeepFrameBuffer::~DeepFrameBuffer((DeepFrameBuffer *)0x127360);
  return;
}

Assistant:

void
loadLevel (DeepTiledInputFile& in, DeepImage& img, int x, int y)
{
    DeepImageLevel& level = img.level (x, y);
    DeepFrameBuffer fb;

    fb.insertSampleCountSlice (level.sampleCounts ().slice ());

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    in.setFrameBuffer (fb);

    {
        SampleCountChannel::Edit edit (level.sampleCounts ());

        in.readPixelSampleCounts (
            0, in.numXTiles (x) - 1, 0, in.numYTiles (y) - 1, x, y);
    }

    in.readTiles (0, in.numXTiles (x) - 1, 0, in.numYTiles (y) - 1, x, y);
}